

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_draw_io(t_vu *x,_glist *glist,int old_snd_rcv_flags)

{
  int iVar1;
  int iVar2;
  t_iem_fstyle_flags tVar3;
  int iVar4;
  int iVar5;
  _glist *p_Var6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *tags [3];
  char tag_n [128];
  char tag [128];
  char tag_label [128];
  char tag_object [128];
  
  p_Var6 = (x->x_gui).x_glist;
  iVar1 = p_Var6->gl_zoom;
  p_Var6 = glist_getcanvas(p_Var6);
  iVar4 = text_xpix((t_text *)x,glist);
  iVar5 = text_ypix((t_text *)x,glist);
  tVar3 = (x->x_gui).x_fsf;
  tags[0] = tag_object;
  tags[1] = tag_n;
  tags[2] = tag;
  sprintf(tags[0],"%lxOBJ",x);
  sprintf(tag_label,"%lxLABEL",x);
  sprintf(tag,"%lxOUT",x);
  pdgui_vmess((char *)0x0,"crs",p_Var6,"delete",tag);
  if (((uint)tVar3 & 0xc0) == 0) {
    sprintf(tag_n,"%lxOUT%d",x,0);
    iVar2 = (x->x_gui).x_h;
    iVar8 = iVar5 + iVar1 * 2;
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var6,"create","rectangle",
                (ulong)(uint)(iVar4 - iVar1),(ulong)(uint)(iVar2 + iVar5),
                (ulong)(uint)((iVar4 - iVar1) + iVar1 * 7),(ulong)(uint)(iVar2 + iVar8),"-fill",
                "black","-tags",3,tags);
    sprintf(tag_n,"%lxOUT%d",x,1);
    uVar7 = iVar4 + iVar1 + (x->x_gui).x_w;
    iVar2 = (x->x_gui).x_h;
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var6,"create","rectangle",(ulong)(uVar7 + iVar1 * -7)
                ,(ulong)(uint)(iVar2 + iVar5),(ulong)uVar7,(ulong)(uint)(iVar8 + iVar2),"-fill",
                "black","-tags",3,tags);
    pdgui_vmess((char *)0x0,"crss",p_Var6,"lower",tag,tag_label);
  }
  sprintf(tag,"%lxIN",x);
  pdgui_vmess((char *)0x0,"crs",p_Var6,"delete",tag);
  if (((uint)(x->x_gui).x_fsf & 0x40) == 0) {
    sprintf(tag_n,"%lxIN%d",x,0);
    uVar7 = iVar5 + iVar1 * -2;
    uVar10 = (ulong)(uVar7 + iVar1 * 2);
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var6,"create","rectangle",
                (ulong)(uint)(iVar4 - iVar1),(ulong)uVar7,(ulong)(uint)(iVar1 * 7 + (iVar4 - iVar1))
                ,uVar10,"-fill","black","-tags",3,tags);
    sprintf(tag_n,"%lxIN%d",x,1);
    uVar9 = iVar4 + iVar1 + (x->x_gui).x_w;
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var6,"create","rectangle",(ulong)(uVar9 + iVar1 * -7)
                ,(ulong)uVar7,(ulong)uVar9,uVar10,"-fill","black","-tags",3,tags);
    pdgui_vmess((char *)0x0,"crss",p_Var6,"lower",tag,tag_label);
  }
  return;
}

Assistant:

static void vu_draw_io(t_vu* x, t_glist* glist, int old_snd_rcv_flags)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int hmargin = HMARGIN * zoom, vmargin = VMARGIN * zoom;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int snd_able = x->x_gui.x_fsf.x_snd_able || x->x_gui.x_fsf.x_rcv_able;
    char tag_object[128], tag_label[128], tag[128], tag_n[128];
    char *tags[] = {tag_object, tag_n, tag};

    (void)old_snd_rcv_flags;

    sprintf(tag_object, "%lxOBJ", x);
    sprintf(tag_label, "%lxLABEL", x);

    /* re-create outlets */
    sprintf(tag, "%lxOUT", x);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!snd_able)
    {
        sprintf(tag_n, "%lxOUT%d", x, 0);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos - hmargin, ypos + x->x_gui.x_h + vmargin + zoom - ioh,
            xpos - hmargin + iow, ypos + x->x_gui.x_h + vmargin,
            "-fill", "black",
            "-tags", 3, tags);

        sprintf(tag_n, "%lxOUT%d", x, 1);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos + x->x_gui.x_w + hmargin - iow, ypos + x->x_gui.x_h + vmargin + zoom - ioh,
            xpos + x->x_gui.x_w + hmargin, ypos + x->x_gui.x_h + vmargin,
            "-fill", "black",
            "-tags", 3, tags);
            /* keep label above outlets */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_label);
    }

    sprintf(tag, "%lxIN", x);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_rcv_able)
    {
        sprintf(tag_n, "%lxIN%d", x, 0);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos - hmargin, ypos - vmargin,
            xpos - hmargin + iow, ypos - vmargin - zoom + ioh,
            "-fill", "black",
            "-tags", 3, tags);

        sprintf(tag_n, "%lxIN%d", x, 1);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos + x->x_gui.x_w + hmargin - iow, ypos - vmargin,
            xpos + x->x_gui.x_w + hmargin, ypos - vmargin - zoom + ioh,
            "-fill", "black",
            "-tags", 3, tags);
            /* keep label above inlets */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_label);
    }
}